

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void BufferHandler::setupBuffers
               (uint *vboHandle,float *positionData,float *normalData,float *textureData,int sizes)

{
  (*glad_glGenBuffers)(3,vboHandle);
  (*glad_glBindBuffer)(0x8892,*vboHandle);
  (*glad_glBufferData)(0x8892,(long)sizes << 2,positionData,0x88e4);
  (*glad_glBindBuffer)(0x8892,vboHandle[1]);
  (*glad_glBufferData)(0x8892,(long)sizes << 2,normalData,0x88e4);
  (*glad_glBindBuffer)(0x8892,vboHandle[2]);
  (*glad_glBufferData)(0x8892,0x120,textureData,0x88e4);
  return;
}

Assistant:

static void setupBuffers(unsigned int *vboHandle,float *positionData,float *normalData,float *textureData,int sizes) {
         //Generate 3 Buffers
        glGenBuffers(3,vboHandle);

        //Bind Position Data Buffer to vboHandl[0]
        glBindBuffer(GL_ARRAY_BUFFER,vboHandle[0]);
        glBufferData(GL_ARRAY_BUFFER,sizeof(float)*sizes,positionData,GL_STATIC_DRAW);

        //Bind Normal Data Buffer to vboHandle[1]
        glBindBuffer(GL_ARRAY_BUFFER,vboHandle[1]);
        glBufferData(GL_ARRAY_BUFFER,sizeof(float)*sizes,normalData,GL_STATIC_DRAW);

        //Bind Texture Data Buffer to vboHandle[2]
        glBindBuffer(GL_ARRAY_BUFFER,vboHandle[2]);
        glBufferData(GL_ARRAY_BUFFER,sizeof(float)*72,textureData,GL_STATIC_DRAW);

     }